

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::SequenceMethodExprVisitor::visit<slang::ast::NullLiteral>
          (SequenceMethodExprVisitor *this,NullLiteral *expr)

{
  Symbol *this_00;
  AssertionPortSymbol *pAVar1;
  Diagnostic *this_01;
  
  if ((expr->super_Expression).kind == NamedValue) {
    this_00 = Expression::getSymbolReference(&expr->super_Expression,true);
    if (this_00 != (Symbol *)0x0) {
      if (this_00->kind == LocalAssertionVar) {
LAB_002ebdb6:
        this_01 = ASTContext::addDiag(this->context,(DiagCode)0x23000b,
                                      (expr->super_Expression).sourceRange);
        Diagnostic::operator<<(this_01,&this->name);
        return;
      }
      if (this_00->kind == AssertionPort) {
        pAVar1 = Symbol::as<slang::ast::AssertionPortSymbol>(this_00);
        if ((pAVar1->localVarDirection).
            super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged == true)
        goto LAB_002ebdb6;
      }
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.kind == ExpressionKind::NamedValue) {
                if (auto sym = expr.getSymbolReference()) {
                    if (sym->kind == SymbolKind::LocalAssertionVar ||
                        (sym->kind == SymbolKind::AssertionPort &&
                         sym->template as<AssertionPortSymbol>().isLocalVar())) {
                        context.addDiag(diag::SequenceMethodLocalVar, expr.sourceRange) << name;
                    }
                }
            }
        }

        if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, SequenceMethodExprVisitor>)
            expr.visitExprs(*this);
    }